

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChContactTriangleXYZROT::GetContactPointSpeed
          (ChVector<double> *__return_storage_ptr__,ChContactTriangleXYZROT *this,
          ChVector<double> *loc_point,ChState *state_x,ChStateDelta *state_w)

{
  ChVector<double> *v;
  double s3;
  double s2;
  double local_f8;
  undefined8 uStack_f0;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_e0 [56];
  ChVector<double> A3_dt;
  ChVector<double> A2_dt;
  ChVector<double> A1_dt;
  ChVector<double> local_48;
  
  local_48.m_data[0] = loc_point->m_data[0];
  local_48.m_data[1] = loc_point->m_data[1];
  local_48.m_data[2] = loc_point->m_data[2];
  ComputeUVfromP(this,&local_48,&s2,&s3);
  local_f8 = (1.0 - s2) - s3;
  uStack_f0 = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_e0,
             &state_w->super_ChVectorDynamic<double>,0,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&A1_dt,local_e0,(type *)0x0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_e0,
             &state_w->super_ChVectorDynamic<double>,6,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&A2_dt,local_e0,(type *)0x0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_e0,
             &state_w->super_ChVectorDynamic<double>,0xc,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&A3_dt,local_e0,(type *)0x0);
  __return_storage_ptr__->m_data[0] =
       local_f8 * A1_dt.m_data[0] + s2 * A2_dt.m_data[0] + s3 * A3_dt.m_data[0];
  __return_storage_ptr__->m_data[1] =
       local_f8 * A1_dt.m_data[1] + s2 * A2_dt.m_data[1] + s3 * A3_dt.m_data[1];
  __return_storage_ptr__->m_data[2] =
       local_f8 * A1_dt.m_data[2] + s2 * A2_dt.m_data[2] + s3 * A3_dt.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChContactTriangleXYZROT::GetContactPointSpeed(const ChVector<>& loc_point,
                                                         const ChState& state_x,
                                                         const ChStateDelta& state_w) {
    // Note: because the reference coordinate system for a ChContactTriangleXYZROT is the identity,
    // the given point loc_point is actually expressed in the global frame. In this case, we
    // calculate the output point here by assuming that its barycentric coordinates do not change
    // with a change in the states of this object.
    double s2, s3;
    ComputeUVfromP(loc_point, s2, s3);
    double s1 = 1 - s2 - s3;

    ChVector<> A1_dt(state_w.segment(0, 3));
    ChVector<> A2_dt(state_w.segment(6, 3));
    ChVector<> A3_dt(state_w.segment(12, 3));

    return s1 * A1_dt + s2 * A2_dt + s3 * A3_dt;
}